

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

void __thiscall duckdb::StringValueScanner::Flush(StringValueScanner *this,DataChunk *insert_chunk)

{
  LogicalType *this_00;
  CSVReaderOptions *pCVar1;
  _Hash_node_base *p_Var2;
  __buckets_ptr pp_Var3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  LinesPerBoundary error_info;
  LinesPerBoundary error_info_00;
  optional_idx byte_position;
  optional_idx byte_position_00;
  bool bVar6;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_01;
  reference result;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  undefined4 extraout_var;
  DataChunk *this_02;
  CSVErrorHandler *pCVar11;
  CSVFileScan *pCVar12;
  CSVBufferManager *pCVar13;
  CSVStateMachine *pCVar14;
  mapped_type *pmVar15;
  ostream *poVar16;
  mapped_type *pmVar17;
  CSVReaderOptions *pCVar18;
  __node_base_ptr p_Var19;
  CSVBufferHandle *pCVar20;
  InvalidInputException *this_03;
  byte bVar21;
  idx_t iVar22;
  LogicalTypeId type;
  ulong uVar23;
  _Hash_node_base *p_Var24;
  string *__n;
  shared_ptr<duckdb::CSVFileScan,_true> *this_04;
  string *__n_00;
  ulong uVar25;
  __node_base_ptr p_Var26;
  bool first_nl_1;
  idx_t line_error;
  string error_msg;
  __hashtable *__h;
  string borked_line;
  string error_message;
  bool first_nl;
  LinesPerBoundary lines_per_batch;
  vector<duckdb::Value,_true> row;
  UnifiedVectorFormat parse_column_data;
  UnifiedVectorFormat inserted_column_data;
  ostringstream error;
  undefined4 in_stack_fffffffffffffbac;
  undefined7 in_stack_fffffffffffffbb8;
  bool in_stack_fffffffffffffbbf;
  pointer local_440;
  reference local_438;
  string local_430;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_410;
  DataChunk *local_408;
  shared_ptr<duckdb::CSVStateMachine,_true> *local_400;
  LogicalType *local_3f8;
  string *local_3f0;
  shared_ptr<duckdb::CSVBufferHandle,_true> *local_3e8;
  shared_ptr<duckdb::CSVErrorHandler,_true> *local_3e0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_3d8;
  string *local_3d0;
  unordered_map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
  *local_3c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_3c0;
  StringValueScanner *local_3b8;
  shared_ptr<duckdb::CSVFileScan,_true> *local_3b0;
  string local_3a8;
  string local_388;
  LinesPerBoundary local_368;
  LinesPerBoundary local_358;
  undefined8 local_348;
  shared_ptr<duckdb::CSVBufferManager,_true> *local_338;
  reference local_330;
  undefined1 local_328 [48];
  undefined1 local_2f8 [32];
  _Alloc_hider local_2d8;
  char local_2c8 [48];
  string *local_298;
  idx_t iStack_290;
  LogicalType local_280;
  LogicalType local_268;
  LogicalType local_250;
  UnifiedVectorFormat local_238;
  UnifiedVectorFormat local_1f0;
  Value local_1a8;
  ios_base local_138 [264];
  
  local_3e0 = &(this->super_BaseScanner).error_handler;
  local_3b0 = &(this->super_BaseScanner).csv_file_scan;
  local_338 = &(this->super_BaseScanner).buffer_manager;
  local_400 = &(this->super_BaseScanner).state_machine;
  local_410 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)&(this->result).line_positions_per_row;
  local_3c8 = &(this->result).buffer_handles;
  local_3d0 = &(this->result).path;
  local_3d8 = &(this->result).borked_rows._M_h;
  local_3e8 = &(this->super_BaseScanner).cur_buffer_handle;
  local_408 = insert_chunk;
  local_3b8 = this;
  do {
    this_04 = local_3b0;
    iVar10 = (*(this->super_BaseScanner)._vptr_BaseScanner[2])(this);
    this_02 = StringValueResult::ToChunk((StringValueResult *)CONCAT44(extraout_var,iVar10));
    DataChunk::Reset(local_408);
    pCVar11 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(local_3e0);
    CSVErrorHandler::ErrorIfNeeded(pCVar11);
    if (this_02->count == 0) {
      return;
    }
    local_408->count = this_02->count;
    pCVar12 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_04);
    local_3c0 = CSVFileScan::GetNames_abi_cxx11_(pCVar12);
    pCVar12 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_04);
    if ((pCVar12->super_BaseFileReader).column_ids.column_ids.
        super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
        .
        super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pCVar12->super_BaseFileReader).column_ids.column_ids.
        super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
        .
        super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n_00 = (string *)0x0;
      do {
        pCVar12 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_04);
        __n = __n_00;
        if ((pCVar12->projection_ids).
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pCVar12->projection_ids).
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pCVar12 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(this_04);
          __n = (string *)
                (pCVar12->projection_ids).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)__n_00].second;
        }
        if ((string *)
            (((long)(this_02->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this_02->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5) <= __n_00) {
          this_03 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_1a8.type_._0_8_ = (long)&local_1a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1a8,"Mismatch between the schema of different files","");
          InvalidInputException::InvalidInputException(this_03,(string *)&local_1a8);
          __cxa_throw(this_03,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        local_3f0 = __n_00;
        local_438 = vector<duckdb::Vector,_true>::operator[](&this_02->data,(size_type)__n_00);
        local_330 = vector<duckdb::Vector,_true>::operator[](&local_408->data,(size_type)__n);
        this_00 = &local_330->type;
        bVar7 = LogicalType::IsJSONType(this_00);
        local_3f8 = this_00;
        if (bVar7) {
          bVar8 = false;
LAB_00d23eab:
          bVar6 = false;
          bVar9 = false;
        }
        else {
          LogicalType::LogicalType(&local_250,VARCHAR);
          bVar8 = LogicalType::operator==(this_00,&local_250);
          if (bVar8) {
            bVar9 = true;
            bVar8 = false;
            bVar6 = false;
          }
          else {
            LogicalType::LogicalType(&local_268,VARCHAR);
            bVar8 = LogicalType::operator==(local_3f8,&local_268);
            if (bVar8) {
              bVar8 = true;
              goto LAB_00d23eab;
            }
            LogicalType::LogicalType(&local_280,VARCHAR);
            bVar9 = LogicalType::operator==(&local_438->type,&local_280);
            bVar9 = !bVar9;
            bVar8 = true;
            bVar6 = true;
          }
        }
        if (bVar6) {
          LogicalType::~LogicalType(&local_280);
        }
        if (bVar8) {
          LogicalType::~LogicalType(&local_268);
        }
        result = local_330;
        if (!bVar7) {
          LogicalType::~LogicalType(&local_250);
        }
        if (bVar9) {
          Vector::Reinterpret(result,local_438);
          this = local_3b8;
        }
        else {
          local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
          local_388._M_string_length = 0;
          local_388.field_2._M_local_buf[0] = '\0';
          local_440 = (pointer)0x0;
          pCVar13 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(local_338);
          this = local_3b8;
          bVar7 = VectorOperations::TryCast
                            (pCVar13->context,local_438,result,this_02->count,&local_388,false,true)
          ;
          if (!bVar7) {
            UnifiedVectorFormat::UnifiedVectorFormat(&local_1f0);
            Vector::ToUnifiedFormat(result,this_02->count,&local_1f0);
            UnifiedVectorFormat::UnifiedVectorFormat(&local_238);
            Vector::ToUnifiedFormat(local_438,this_02->count,&local_238);
            if (local_440 < (pointer)this_02->count) {
              do {
                if (((local_1f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                      (unsigned_long *)0x0) &&
                    ((local_1f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [(ulong)local_440 >> 6] >> ((ulong)local_440 & 0x3f) & 1) == 0)) &&
                   ((local_238.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                     (unsigned_long *)0x0 ||
                    ((local_238.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [(ulong)local_440 >> 6] >> ((ulong)local_440 & 0x3f) & 1) != 0)))) break;
                local_440 = local_440 + 1;
              } while (local_440 < (pointer)this_02->count);
            }
            pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(local_400);
            if ((pCVar14->options->ignore_errors).value == true) {
              local_328._0_8_ = (pointer)0x0;
              local_328._8_8_ = (element_type *)0x0;
              local_328._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if ((this_02->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  (this_02->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                iVar22 = 0;
                do {
                  DataChunk::GetValue(&local_1a8,this_02,iVar22,(idx_t)local_440);
                  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
                  emplace_back<duckdb::Value>
                            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_328,
                             &local_1a8);
                  Value::~Value(&local_1a8);
                  iVar22 = iVar22 + 1;
                } while (iVar22 < (ulong)(((long)(this_02->data).
                                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                 .
                                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this_02->data).
                                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                 .
                                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                         0x4ec4ec4ec4ec4ec5));
              }
              ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                        ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_328);
            }
            pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(local_400);
            bVar7 = CSVReaderOptions::IgnoreErrors(pCVar14->options);
            if (!bVar7) {
              LinesPerBoundary::LinesPerBoundary
                        (&local_358,(this->super_BaseScanner).iterator.boundary.boundary_idx,
                         (idx_t)(local_440 + ((this->super_BaseScanner).lines_read - this_02->count)
                                ));
              local_368.boundary_idx._0_1_ = 0;
              pmVar15 = ::std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[](local_410,(key_type *)&local_440);
              if ((this->result).super_ScannerResult.result_size == 1) {
                bVar21 = false;
              }
              else {
                pCVar1 = ((this->result).super_ScannerResult.state_machine)->options;
                bVar21 = true;
                if ((pCVar1->store_rejects).value == false) {
                  bVar21 = (pCVar1->ignore_errors).value ^ 1;
                }
              }
              FullLinePosition::
              ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
                        (&local_3a8,pmVar15,(bool *)&local_368,local_3c8,(bool)bVar21);
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,"Could not convert string \"",0x1a);
              Vector::GetValue((Value *)local_328,local_438,(idx_t)local_440);
              poVar16 = duckdb::operator<<((ostream *)&local_1a8,(Value *)local_328);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" to \'",6);
              LogicalType::ToString_abi_cxx11_(&local_430,local_3f8);
              poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar16,local_430._M_dataplus._M_p,local_430._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\'",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_430._M_dataplus._M_p != &local_430.field_2) {
                operator_delete(local_430._M_dataplus._M_p);
              }
              Value::~Value((Value *)local_328);
              ::std::__cxx11::stringbuf::str();
              FullLinePosition::SanitizeError(&local_430);
              this_01 = local_410;
              pmVar15 = ::std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[](local_410,(key_type *)&local_440);
              pmVar17 = ::std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[](this_01,(key_type *)&local_440);
              if ((((pmVar15->begin).buffer_pos == (pmVar17->end).buffer_pos) &&
                  ((pmVar15->begin).buffer_idx == (pmVar17->end).buffer_idx)) &&
                 ((pmVar15->begin).buffer_size == (pmVar17->end).buffer_size)) {
                iVar22 = 0;
              }
              else {
                pmVar15 = ::std::__detail::
                          _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[](local_410,(key_type *)&local_440);
                iVar22 = (ulong)(byte)local_368.boundary_idx + (pmVar15->begin).buffer_pos +
                         (pmVar15->begin).buffer_idx *
                         (this->result).super_ScannerResult.result_size;
              }
              pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(local_400);
              pCVar1 = pCVar14->options;
              pCVar18 = (CSVReaderOptions *)
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ::operator[](local_3c0,(size_type)local_3f0);
              error_info.lines_in_batch = iVar22;
              error_info.boundary_idx = local_358.lines_in_batch;
              byte_position.index._4_4_ = in_stack_fffffffffffffbac;
              byte_position.index._0_4_ = (uint)local_3f8->id_;
              CSVError::CastError((CSVError *)local_328,(CSVError *)pCVar1,pCVar18,&local_430,
                                  local_3f0,(idx_t)&local_3a8,(string *)local_358.boundary_idx,
                                  error_info,0xffffffffffffffff,byte_position,
                                  (LogicalTypeId)local_3d0,
                                  (string *)
                                  CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
              pCVar11 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(local_3e0);
              CSVErrorHandler::Error(pCVar11,(CSVError *)local_328,false);
              if (local_2d8._M_p != local_2c8) {
                operator_delete(local_2d8._M_p);
              }
              if ((undefined1 *)local_328._32_8_ != local_2f8) {
                operator_delete((void *)local_328._32_8_);
              }
              if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
                operator_delete((void *)local_328._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_430._M_dataplus._M_p != &local_430.field_2) {
                operator_delete(local_430._M_dataplus._M_p);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              ::std::ios_base::~ios_base(local_138);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
                operator_delete(local_3a8._M_dataplus._M_p);
              }
            }
            local_328._0_8_ = local_440;
            local_1a8.type_._0_8_ = local_3d8;
            local_440 = local_440 + 1;
            ::std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_3d8,local_328,&local_1a8);
            for (; local_440 < (pointer)this_02->count; local_440 = local_440 + 1) {
              if (((local_1f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                    (unsigned_long *)0x0) &&
                  ((local_1f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)local_440 >> 6] >> ((ulong)local_440 & 0x3f) & 1) == 0)) &&
                 ((local_238.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_238.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)local_440 >> 6] >> ((ulong)local_440 & 0x3f) & 1) != 0)))) {
                local_1a8.type_._0_8_ = local_3d8;
                ::std::
                _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                          ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)local_3d8,&local_440,&local_1a8);
                local_358.boundary_idx = 0;
                local_358.lines_in_batch = 0;
                local_348 = 0;
                if ((this_02->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    (this_02->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  iVar22 = 0;
                  do {
                    DataChunk::GetValue(&local_1a8,this_02,iVar22,(idx_t)local_440);
                    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
                    emplace_back<duckdb::Value>
                              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_358,
                               &local_1a8);
                    Value::~Value(&local_1a8);
                    iVar22 = iVar22 + 1;
                  } while (iVar22 < (ulong)(((long)(this_02->data).
                                                                                                      
                                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                  .
                                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(this_02->data).
                                                                                                      
                                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                  .
                                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                           0x4ec4ec4ec4ec4ec5));
                }
                pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(local_400);
                bVar7 = CSVReaderOptions::IgnoreErrors(pCVar14->options);
                if (!bVar7) {
                  LinesPerBoundary::LinesPerBoundary
                            (&local_368,(this->super_BaseScanner).iterator.boundary.boundary_idx,
                             (idx_t)(local_440 +
                                    ((this->super_BaseScanner).lines_read - this_02->count)));
                  in_stack_fffffffffffffbbf = false;
                  pmVar15 = ::std::__detail::
                            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[](local_410,(key_type *)&local_440);
                  if ((this->result).super_ScannerResult.result_size == 1) {
                    bVar21 = false;
                  }
                  else {
                    pCVar1 = ((this->result).super_ScannerResult.state_machine)->options;
                    bVar21 = true;
                    if ((pCVar1->store_rejects).value == false) {
                      bVar21 = (pCVar1->ignore_errors).value ^ 1;
                    }
                  }
                  FullLinePosition::
                  ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
                            (&local_3a8,pmVar15,(bool *)&stack0xfffffffffffffbbf,local_3c8,
                             (bool)bVar21);
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,"Could not convert string \"",0x1a);
                  Vector::GetValue((Value *)local_328,local_438,(idx_t)local_440);
                  poVar16 = duckdb::operator<<((ostream *)&local_1a8,(Value *)local_328);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" to \'",6);
                  LogicalTypeIdToString_abi_cxx11_(&local_430,(duckdb *)(ulong)local_3f8->id_,type);
                  poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar16,local_430._M_dataplus._M_p,local_430._M_string_length
                                      );
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\'",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_430._M_dataplus._M_p != &local_430.field_2) {
                    operator_delete(local_430._M_dataplus._M_p);
                  }
                  Value::~Value((Value *)local_328);
                  ::std::__cxx11::stringbuf::str();
                  FullLinePosition::SanitizeError(&local_430);
                  pCVar14 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(local_400);
                  pCVar1 = pCVar14->options;
                  pCVar18 = (CSVReaderOptions *)
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ::operator[](local_3c0,(size_type)local_3f0);
                  local_298 = (string *)
                              CONCAT71(local_368.boundary_idx._1_7_,(byte)local_368.boundary_idx);
                  iStack_290 = local_368.lines_in_batch;
                  pmVar15 = ::std::__detail::
                            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[](local_410,(key_type *)&local_440);
                  error_info_00.lines_in_batch =
                       (ulong)in_stack_fffffffffffffbbf + (pmVar15->begin).buffer_pos +
                       (pmVar15->begin).buffer_idx * (this->result).super_ScannerResult.result_size;
                  error_info_00.boundary_idx = iStack_290;
                  byte_position_00.index._4_4_ = in_stack_fffffffffffffbac;
                  byte_position_00.index._0_4_ = (uint)local_3f8->id_;
                  CSVError::CastError((CSVError *)local_328,(CSVError *)pCVar1,pCVar18,&local_430,
                                      local_3f0,(idx_t)&local_3a8,local_298,error_info_00,
                                      0xffffffffffffffff,byte_position_00,(LogicalTypeId)local_3d0,
                                      (string *)
                                      CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8))
                  ;
                  pCVar11 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->(local_3e0);
                  CSVErrorHandler::Error(pCVar11,(CSVError *)local_328,false);
                  if (local_2d8._M_p != local_2c8) {
                    operator_delete(local_2d8._M_p);
                  }
                  if ((undefined1 *)local_328._32_8_ != local_2f8) {
                    operator_delete((void *)local_328._32_8_);
                  }
                  if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
                    operator_delete((void *)local_328._0_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_430._M_dataplus._M_p != &local_430.field_2) {
                    operator_delete(local_430._M_dataplus._M_p);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                  ::std::ios_base::~ios_base(local_138);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
                    operator_delete(local_3a8._M_dataplus._M_p);
                  }
                }
                ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                          ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_358);
              }
            }
            if (local_238.owned_sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_238.owned_sel.selection_data.internal.
                         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_238.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_238.validity.super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if (local_1f0.owned_sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1f0.owned_sel.selection_data.internal.
                         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_1f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != &local_388.field_2) {
            operator_delete(local_388._M_dataplus._M_p);
          }
        }
        this_04 = local_3b0;
        __n_00 = (string *)((long)&(local_3f0->_M_dataplus)._M_p + 1);
        pCVar12 = shared_ptr<duckdb::CSVFileScan,_true>::operator->(local_3b0);
      } while (__n_00 < (string *)
                        ((long)(pCVar12->super_BaseFileReader).column_ids.column_ids.
                               super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                               .
                               super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pCVar12->super_BaseFileReader).column_ids.column_ids.
                               super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                               .
                               super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if ((this->result).borked_rows._M_h._M_element_count != 0) {
      SelectionVector::SelectionVector((SelectionVector *)&local_1a8,this_02->count);
      p_Var2 = (_Hash_node_base *)this_02->count;
      if (p_Var2 == (_Hash_node_base *)0x0) {
        iVar22 = 0;
      }
      else {
        pp_Var3 = (this->result).borked_rows._M_h._M_buckets;
        uVar25 = (this->result).borked_rows._M_h._M_bucket_count;
        iVar22 = 0;
        p_Var24 = (_Hash_node_base *)0x0;
        do {
          uVar23 = (ulong)p_Var24 % uVar25;
          p_Var4 = pp_Var3[uVar23];
          p_Var19 = (__node_base_ptr)0x0;
          if ((p_Var4 != (__node_base_ptr)0x0) &&
             (p_Var19 = p_Var4, p_Var26 = p_Var4->_M_nxt, p_Var24 != p_Var4->_M_nxt[1]._M_nxt)) {
            while (p_Var5 = p_Var26->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
              p_Var19 = (__node_base_ptr)0x0;
              if (((ulong)p_Var5[1]._M_nxt % uVar25 != uVar23) ||
                 (p_Var19 = p_Var26, p_Var26 = p_Var5, p_Var24 == p_Var5[1]._M_nxt))
              goto LAB_00d24979;
            }
            p_Var19 = (__node_base_ptr)0x0;
          }
LAB_00d24979:
          if ((p_Var19 == (__node_base_ptr)0x0) || (p_Var19->_M_nxt == (_Hash_node_base *)0x0)) {
            *(int *)(local_1a8.type_._0_8_ + iVar22 * 4) = (int)p_Var24;
            iVar22 = iVar22 + 1;
          }
          p_Var24 = (_Hash_node_base *)((long)&p_Var24->_M_nxt + 1);
        } while (p_Var24 != p_Var2);
      }
      DataChunk::Slice(local_408,(SelectionVector *)&local_1a8,iVar22);
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::clear(local_3d8);
      if (local_1a8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1a8.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    if (local_408->count != 0) {
      return;
    }
    if ((local_3e8->internal).
        super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      return;
    }
    if ((this->super_BaseScanner).iterator.is_set == true) {
      uVar25 = (this->super_BaseScanner).iterator.boundary.end_pos;
      pCVar20 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(local_3e8);
      if (pCVar20->actual_size < uVar25) goto LAB_00d24a03;
    }
    else {
LAB_00d24a03:
      pCVar20 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(local_3e8);
      uVar25 = pCVar20->actual_size;
    }
    if (uVar25 <= (this->super_BaseScanner).iterator.pos.buffer_pos) {
      return;
    }
  } while( true );
}

Assistant:

void StringValueScanner::Flush(DataChunk &insert_chunk) {
	bool continue_processing;
	do {
		continue_processing = false;
		auto &process_result = ParseChunk();
		// First Get Parsed Chunk
		auto &parse_chunk = process_result.ToChunk();
		insert_chunk.Reset();
		// We have to check if we got to error
		error_handler->ErrorIfNeeded();
		if (parse_chunk.size() == 0) {
			return;
		}
		// convert the columns in the parsed chunk to the types of the table
		insert_chunk.SetCardinality(parse_chunk);

		// We keep track of the borked lines, in case we are ignoring errors
		D_ASSERT(csv_file_scan);

		auto &names = csv_file_scan->GetNames();
		// Now Do the cast-aroo
		for (idx_t i = 0; i < csv_file_scan->column_ids.size(); i++) {
			idx_t result_idx = i;
			if (!csv_file_scan->projection_ids.empty()) {
				result_idx = csv_file_scan->projection_ids[i].second;
			}
			if (i >= parse_chunk.ColumnCount()) {
				throw InvalidInputException("Mismatch between the schema of different files");
			}
			auto &parse_vector = parse_chunk.data[i];
			auto &result_vector = insert_chunk.data[result_idx];
			auto &type = result_vector.GetType();
			auto &parse_type = parse_vector.GetType();
			if (!type.IsJSONType() && (type == LogicalType::VARCHAR ||
			                           (type != LogicalType::VARCHAR && parse_type != LogicalType::VARCHAR))) {
				// reinterpret rather than reference
				result_vector.Reinterpret(parse_vector);
			} else {
				string error_message;
				idx_t line_error = 0;
				if (VectorOperations::TryCast(buffer_manager->context, parse_vector, result_vector, parse_chunk.size(),
				                              &error_message, false, true)) {
					continue;
				}
				// An error happened, to propagate it we need to figure out the exact line where the casting failed.
				UnifiedVectorFormat inserted_column_data;
				result_vector.ToUnifiedFormat(parse_chunk.size(), inserted_column_data);
				UnifiedVectorFormat parse_column_data;
				parse_vector.ToUnifiedFormat(parse_chunk.size(), parse_column_data);

				for (; line_error < parse_chunk.size(); line_error++) {
					if (!inserted_column_data.validity.RowIsValid(line_error) &&
					    parse_column_data.validity.RowIsValid(line_error)) {
						break;
					}
				}
				{
					if (state_machine->options.ignore_errors.GetValue()) {
						vector<Value> row;
						for (idx_t col = 0; col < parse_chunk.ColumnCount(); col++) {
							row.push_back(parse_chunk.GetValue(col, line_error));
						}
					}
					if (!state_machine->options.IgnoreErrors()) {
						LinesPerBoundary lines_per_batch(iterator.GetBoundaryIdx(),
						                                 lines_read - parse_chunk.size() + line_error);
						bool first_nl = false;
						auto borked_line = result.line_positions_per_row[line_error].ReconstructCurrentLine(
						    first_nl, result.buffer_handles, result.PrintErrorLine());
						std::ostringstream error;
						error << "Could not convert string \"" << parse_vector.GetValue(line_error) << "\" to \'"
						      << type.ToString() << "\'";
						string error_msg = error.str();
						FullLinePosition::SanitizeError(error_msg);
						idx_t row_byte_pos = 0;
						if (!(result.line_positions_per_row[line_error].begin ==
						      result.line_positions_per_row[line_error].end)) {
							row_byte_pos = result.line_positions_per_row[line_error].begin.GetGlobalPosition(
							    result.result_size, first_nl);
						}
						auto csv_error = CSVError::CastError(
						    state_machine->options, names[i], error_msg, i, borked_line, lines_per_batch, row_byte_pos,
						    optional_idx::Invalid(), result_vector.GetType().id(), result.path);
						error_handler->Error(csv_error);
					}
				}
				result.borked_rows.insert(line_error++);
				D_ASSERT(state_machine->options.ignore_errors.GetValue());
				// We are ignoring errors. We must continue but ignoring borked-rows
				for (; line_error < parse_chunk.size(); line_error++) {
					if (!inserted_column_data.validity.RowIsValid(line_error) &&
					    parse_column_data.validity.RowIsValid(line_error)) {
						result.borked_rows.insert(line_error);
						vector<Value> row;
						for (idx_t col = 0; col < parse_chunk.ColumnCount(); col++) {
							row.push_back(parse_chunk.GetValue(col, line_error));
						}
						if (!state_machine->options.IgnoreErrors()) {
							LinesPerBoundary lines_per_batch(iterator.GetBoundaryIdx(),
							                                 lines_read - parse_chunk.size() + line_error);
							bool first_nl = false;
							auto borked_line = result.line_positions_per_row[line_error].ReconstructCurrentLine(
							    first_nl, result.buffer_handles, result.PrintErrorLine());
							std::ostringstream error;
							// Casting Error Message
							error << "Could not convert string \"" << parse_vector.GetValue(line_error) << "\" to \'"
							      << LogicalTypeIdToString(type.id()) << "\'";
							string error_msg = error.str();
							FullLinePosition::SanitizeError(error_msg);
							auto csv_error = CSVError::CastError(
							    state_machine->options, names[i], error_msg, i, borked_line, lines_per_batch,
							    result.line_positions_per_row[line_error].begin.GetGlobalPosition(result.result_size,
							                                                                      first_nl),
							    optional_idx::Invalid(), result_vector.GetType().id(), result.path);
							error_handler->Error(csv_error);
						}
					}
				}
			}
		}
		if (!result.borked_rows.empty()) {
			// We must remove the borked lines from our chunk
			SelectionVector successful_rows(parse_chunk.size());
			idx_t sel_idx = 0;
			for (idx_t row_idx = 0; row_idx < parse_chunk.size(); row_idx++) {
				if (result.borked_rows.find(row_idx) == result.borked_rows.end()) {
					successful_rows.set_index(sel_idx++, row_idx);
				}
			}
			// Now we slice the result
			insert_chunk.Slice(successful_rows, sel_idx);
			result.borked_rows.clear();
		}
		if (insert_chunk.size() == 0 && cur_buffer_handle) {
			idx_t to_pos;
			if (iterator.IsBoundarySet()) {
				to_pos = iterator.GetEndPos();
				if (to_pos > cur_buffer_handle->actual_size) {
					to_pos = cur_buffer_handle->actual_size;
				}
			} else {
				to_pos = cur_buffer_handle->actual_size;
			}
			if (iterator.pos.buffer_pos < to_pos) {
				// If a chunk is complete with errors, we might get to this situation where we must proceed with the
				// scanning
				continue_processing = true;
			}
		}
	} while (continue_processing);
}